

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection2.c
# Opt level: O2

void ssh2_check_termination_callback(void *vctx)

{
  int iVar1;
  
  if (((*(char *)((long)vctx + 0x49) == '\0') && (*(char *)((long)vctx + 0x4a) == '\x01')) &&
     (iVar1 = count234(*(tree234 **)((long)vctx + 0x58)), iVar1 == 0)) {
    if ((*(ssh_sharing_state **)((long)vctx + 8) != (ssh_sharing_state *)0x0) &&
       (iVar1 = share_ndownstreams(*(ssh_sharing_state **)((long)vctx + 8)), 0 < iVar1)) {
      return;
    }
    ssh_user_close(*(Ssh **)((long)vctx + 0x140),"All channels closed");
    return;
  }
  return;
}

Assistant:

static void ssh2_check_termination(struct ssh2_connection_state *s)
{
    /*
     * Decide whether we should terminate the SSH connection now.
     * Called after a channel or a downstream goes away. The general
     * policy is that we terminate when none of either is left.
     */

    if (s->persistent)
        return;     /* persistent mode: never proactively terminate */

    if (!s->started) {
        /* At startup, we don't have any channels open because we
         * haven't got round to opening the main one yet. In that
         * situation, we don't want to terminate, even if a sharing
         * connection opens and closes and causes a call to this
         * function. */
        return;
    }

    if (count234(s->channels) == 0 &&
        !(s->connshare && share_ndownstreams(s->connshare) > 0)) {
        /*
         * We used to send SSH_MSG_DISCONNECT here, because I'd
         * believed that _every_ conforming SSH-2 connection had to
         * end with a disconnect being sent by at least one side;
         * apparently I was wrong and it's perfectly OK to
         * unceremoniously slam the connection shut when you're done,
         * and indeed OpenSSH feels this is more polite than sending a
         * DISCONNECT. So now we don't.
         */
        ssh_user_close(s->ppl.ssh, "All channels closed");
        return;
    }
}